

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiWindow *window;
  ImGuiContext *pIVar3;
  ImGuiID id;
  int iVar4;
  ImGuiColumns *pIVar5;
  ImGuiColumnData *pIVar6;
  ImGuiColumnData *pIVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ImGuiContext *g;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  
  pIVar3 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count >= 1 && columns_count <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                  ,0x1d0a,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  if ((window->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    __assert_fail("window->DC.CurrentColumns == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                  ,0x1d0b,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  id = GetColumnsID(str_id,columns_count);
  pIVar5 = FindOrCreateColumns(window,id);
  if (pIVar5->ID != id) {
    __assert_fail("columns->ID == id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                  ,0x1d10,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  pIVar5->Current = 0;
  pIVar5->Count = columns_count;
  pIVar5->Flags = flags;
  (window->DC).CurrentColumns = pIVar5;
  pIVar5->HostCursorPosY = (window->DC).CursorPos.y;
  pIVar5->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
  IVar2 = (window->ClipRect).Max;
  (pIVar5->HostClipRect).Min = (window->ClipRect).Min;
  (pIVar5->HostClipRect).Max = IVar2;
  IVar2 = (window->WorkRect).Max;
  (pIVar5->HostWorkRect).Min = (window->WorkRect).Min;
  (pIVar5->HostWorkRect).Max = IVar2;
  fVar1 = (pIVar3->Style).ItemSpacing.x;
  fVar16 = (window->WindowPadding).x;
  fVar18 = fVar1 - fVar16;
  fVar16 = fVar16 * 0.5;
  uVar14 = -(uint)(window->WindowBorderSize <= fVar16);
  fVar17 = (window->WorkRect).Max.x;
  fVar18 = (float)(-(uint)(0.0 <= fVar18) & (uint)fVar18);
  fVar21 = (fVar1 + fVar17) - fVar18;
  fVar17 = (float)(int)(float)(~uVar14 & (uint)window->WindowBorderSize | (uint)fVar16 & uVar14) +
           fVar17;
  if (fVar17 <= fVar21) {
    fVar21 = fVar17;
  }
  fVar18 = ((window->DC).Indent.x - fVar1) + fVar18;
  pIVar5->OffMinX = fVar18;
  fVar21 = fVar21 - (window->Pos).x;
  fVar18 = fVar18 + 1.0;
  uVar14 = -(uint)(fVar18 <= fVar21);
  pIVar5->OffMaxX = (float)(~uVar14 & (uint)fVar18 | (uint)fVar21 & uVar14);
  fVar16 = (window->DC).CursorPos.y;
  pIVar5->LineMaxY = fVar16;
  pIVar5->LineMinY = fVar16;
  iVar12 = (pIVar5->Columns).Size;
  iVar9 = columns_count + 1;
  if (iVar12 == iVar9 || iVar12 == 0) {
    pIVar5->IsFirstFrame = iVar12 == 0;
    if (iVar12 == 0) {
      iVar12 = (pIVar5->Columns).Capacity;
      goto LAB_0021116c;
    }
  }
  else {
    iVar12 = (pIVar5->Columns).Capacity;
    if (iVar12 < 0) {
      iVar12 = 0;
      pIVar6 = (ImGuiColumnData *)MemAlloc(0);
      pIVar7 = (pIVar5->Columns).Data;
      if (pIVar7 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar6,pIVar7,(long)(pIVar5->Columns).Size * 0x1c);
        MemFree((pIVar5->Columns).Data);
      }
      (pIVar5->Columns).Data = pIVar6;
      (pIVar5->Columns).Capacity = 0;
    }
    (pIVar5->Columns).Size = 0;
    pIVar5->IsFirstFrame = true;
LAB_0021116c:
    if (iVar12 <= columns_count) {
      pIVar6 = (ImGuiColumnData *)MemAlloc((ulong)(uint)(iVar9 * 0x1c));
      pIVar7 = (pIVar5->Columns).Data;
      if (pIVar7 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar6,pIVar7,(long)(pIVar5->Columns).Size * 0x1c);
        MemFree((pIVar5->Columns).Data);
      }
      (pIVar5->Columns).Data = pIVar6;
      (pIVar5->Columns).Capacity = iVar9;
    }
    iVar12 = (pIVar5->Columns).Size;
    iVar8 = 0;
    do {
      if (iVar12 == (pIVar5->Columns).Capacity) {
        if (iVar12 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = iVar12 / 2 + iVar12;
        }
        iVar11 = iVar12 + 1;
        if (iVar12 + 1 < iVar4) {
          iVar11 = iVar4;
        }
        pIVar7 = (ImGuiColumnData *)MemAlloc((long)iVar11 * 0x1c);
        pIVar6 = (pIVar5->Columns).Data;
        if (pIVar6 != (ImGuiColumnData *)0x0) {
          memcpy(pIVar7,pIVar6,(long)(pIVar5->Columns).Size * 0x1c);
          MemFree((pIVar5->Columns).Data);
        }
        (pIVar5->Columns).Data = pIVar7;
        (pIVar5->Columns).Capacity = iVar11;
        iVar12 = (pIVar5->Columns).Size;
      }
      else {
        pIVar7 = (pIVar5->Columns).Data;
      }
      pIVar7[iVar12].OffsetNorm = (float)iVar8 / (float)columns_count;
      pIVar6 = pIVar7 + iVar12;
      pIVar6->OffsetNormBeforeResize = 0.0;
      pIVar6->Flags = 0;
      (((ImRect *)(&pIVar6->OffsetNormBeforeResize + 2))->Min).x = 0.0;
      (((ImRect *)(&pIVar6->OffsetNormBeforeResize + 2))->Min).y = 0.0;
      pIVar7[iVar12].ClipRect.Max.x = 0.0;
      pIVar7[iVar12].ClipRect.Max.y = 0.0;
      iVar12 = (pIVar5->Columns).Size + 1;
      (pIVar5->Columns).Size = iVar12;
      iVar8 = iVar8 + 1;
    } while (iVar9 != iVar8);
    if (columns_count < 1) goto LAB_0021139c;
  }
  lVar10 = 0xc;
  uVar13 = 0;
  do {
    if ((long)(pIVar5->Columns).Size <= (long)uVar13) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                    ,0x503,"T &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
    }
    pIVar7 = (pIVar5->Columns).Data;
    fVar16 = (window->Pos).x;
    fVar17 = GetColumnOffset((int)uVar13);
    fVar17 = (float)(int)(fVar17 + fVar16 + 0.5);
    fVar16 = (window->Pos).x;
    uVar13 = uVar13 + 1;
    fVar21 = GetColumnOffset((int)uVar13);
    fVar16 = (float)(int)(fVar21 + fVar16 + -1.0 + 0.5);
    *(float *)((long)&pIVar7->OffsetNorm + lVar10) = fVar17;
    *(undefined4 *)((long)&pIVar7->OffsetNormBeforeResize + lVar10) = 0xff7fffff;
    *(float *)((long)&pIVar7->Flags + lVar10) = fVar16;
    *(undefined4 *)((long)&(pIVar7->ClipRect).Min.x + lVar10) = 0x7f7fffff;
    IVar2 = (window->ClipRect).Min;
    fVar21 = IVar2.x;
    fVar18 = IVar2.y;
    uVar14 = -(uint)(fVar21 <= fVar17);
    uVar15 = -(uint)(fVar18 <= -3.4028235e+38);
    *(ulong *)((long)&pIVar7->OffsetNorm + lVar10) =
         CONCAT44(~uVar15 & (uint)fVar18,~uVar14 & (uint)fVar21) |
         CONCAT44(uVar15,(uint)fVar17 & uVar14) & 0xff7fffffffffffff;
    auVar20._8_8_ = 0;
    auVar20._0_4_ = (window->ClipRect).Max.x;
    auVar20._4_4_ = (window->ClipRect).Max.y;
    auVar19._4_4_ = 0x7f7fffff;
    auVar19._0_4_ = fVar16;
    auVar19._8_8_ = 0;
    auVar20 = minps(auVar19,auVar20);
    *(long *)((long)&pIVar7->Flags + lVar10) = auVar20._0_8_;
    lVar10 = lVar10 + 0x1c;
  } while ((uint)columns_count != uVar13);
LAB_0021139c:
  if (1 < pIVar5->Count) {
    ImDrawListSplitter::Split(&window->DrawList->_Splitter,window->DrawList,pIVar5->Count + 1);
    ImDrawListSplitter::SetCurrentChannel(&window->DrawList->_Splitter,window->DrawList,1);
    PushColumnClipRect(0);
  }
  fVar16 = GetColumnOffset(pIVar5->Current);
  fVar17 = GetColumnOffset(pIVar5->Current + 1);
  PushItemWidth((fVar17 - fVar16) * 0.65);
  fVar21 = fVar1 - (window->WindowPadding).x;
  fVar21 = (float)(-(uint)(0.0 <= fVar21) & (uint)fVar21);
  (window->DC).ColumnsOffset.x = fVar21;
  fVar16 = (window->Pos).x;
  (window->DC).CursorPos.x = (float)(int)((window->DC).Indent.x + fVar16 + fVar21);
  (window->WorkRect).Max.x = (fVar17 + fVar16) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1 && columns_count <= 64);   // Maximum 64 columns
    IM_ASSERT(window->DC.CurrentColumns == NULL);           // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostClipRect = window->ClipRect;
    columns->HostWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        window->DrawList->ChannelsSplit(1 + columns->Count);
        window->DrawList->ChannelsSetCurrent(1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}